

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

void nni_sleep_aio(nng_duration ms,nng_aio *aio)

{
  nni_time local_20;
  nng_aio *aio_local;
  nng_duration ms_local;
  
  nni_aio_reset(aio);
  aio->a_expire_ok = true;
  aio->a_sleep = true;
  aio_local._4_4_ = ms;
  if (((uint)aio->a_timeout < 0xfffffffe) && ((ms == -1 || (aio->a_timeout < ms)))) {
    aio->a_expire_ok = false;
    aio_local._4_4_ = aio->a_timeout;
  }
  if (aio_local._4_4_ == -1) {
    local_20 = 0xffffffffffffffff;
  }
  else {
    local_20 = nni_clock();
    local_20 = local_20 + (long)aio_local._4_4_;
  }
  aio->a_expire = local_20;
  nni_aio_start(aio,nni_sleep_cancel,(void *)0x0);
  return;
}

Assistant:

void
nni_sleep_aio(nng_duration ms, nng_aio *aio)
{
	nni_aio_reset(aio);
	aio->a_expire_ok = true;
	aio->a_sleep     = true;
	switch (aio->a_timeout) {
	case NNG_DURATION_DEFAULT:
	case NNG_DURATION_INFINITE:
		// No premature timeout, honor our expected values.
		break;
	default:
		// If the timeout on the aio is shorter than our sleep time,
		// then let it still wake up early, but with NNG_ETIMEDOUT.
		if ((ms == NNG_DURATION_INFINITE) || (ms > aio->a_timeout)) {
			aio->a_expire_ok = false;
			ms               = aio->a_timeout;
		}
	}
	aio->a_expire =
	    ms == NNG_DURATION_INFINITE ? NNI_TIME_NEVER : nni_clock() + ms;

	// we don't do anything else here, so we can ignore the return
	(void) nni_aio_start(aio, nni_sleep_cancel, NULL);
}